

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O1

void R_InitSkins(void)

{
  ulong uVar1;
  uint *puVar2;
  FPlayerSkin *__dest;
  PClassPlayerPawn *pPVar3;
  anon_union_8_2_86621bee_for_spritedef_t_0 aVar4;
  bool bVar5;
  spritedef_t *psVar6;
  FPlayerClass *pFVar7;
  spritedef_t *psVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FTextureID lump;
  PClass *pPVar16;
  PClassActor *pPVar17;
  PClassPlayerPawn *pPVar18;
  PClassPlayerPawn *pPVar19;
  long lVar20;
  uint uVar21;
  FPlayerSkin *pFVar22;
  int lump_00;
  int *piVar23;
  long lVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  int maxframe;
  int lastlump;
  char lname [9];
  spritedef_t temp;
  FSoundID playersoundrefs [17];
  int sndlumps [17];
  char key [65];
  FScanner sc;
  char name [9];
  PClassPlayerPawn *local_ba0;
  int local_b8c;
  int local_b88;
  int local_b84;
  PClassPlayerPawn *local_b80;
  ulong local_b78;
  int local_b6c;
  char local_b68;
  char local_b67;
  char local_b66;
  char local_b65;
  ulong local_b60;
  undefined4 local_b54;
  uint uStack_b50;
  undefined4 local_b4c;
  long local_b48;
  undefined8 local_b40;
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined4 local_af8;
  int aiStack_aec [21];
  char local_a98 [64];
  undefined1 local_a58;
  FScanner local_a48;
  spriteframewithrotate local_948 [29];
  
  lVar20 = 0;
  local_af8 = 0;
  local_b08 = (undefined1  [16])0x0;
  local_b18 = (undefined1  [16])0x0;
  local_b28 = (undefined1  [16])0x0;
  local_b38 = (undefined1  [16])0x0;
  local_a58 = 0;
  uVar21 = PlayerClasses.Count - 1;
  local_b84 = 0;
  do {
    iVar12 = S_FindSound(*(char **)((long)skinsoundnames[0] + lVar20 * 4 + 8));
    *(int *)(local_b38 + lVar20) = iVar12;
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x44);
  local_b60 = (ulong)uVar21;
  do {
    do {
      uVar21 = FWadCollection::FindLump(&Wads,"S_SKIN",&local_b84,true);
      if (uVar21 == 0xffffffff) {
        if (PlayerClasses.Count < numskins) {
          S_HashSounds();
          S_ShrinkPlayerSoundLists();
        }
        return;
      }
      iVar12 = FWadCollection::GetNumLumps(&Wads);
      uVar25 = local_b60;
    } while (iVar12 + -0x17 <= (int)uVar21);
    aiStack_aec[0xd] = 0xffffffff;
    aiStack_aec[0xe] = 0xffffffff;
    aiStack_aec[0xf] = 0xffffffff;
    aiStack_aec[0x10] = 0xffffffff;
    aiStack_aec[9] = 0xffffffff;
    aiStack_aec[10] = 0xffffffff;
    aiStack_aec[0xb] = 0xffffffff;
    aiStack_aec[0xc] = 0xffffffff;
    aiStack_aec[5] = 0xffffffff;
    aiStack_aec[6] = 0xffffffff;
    aiStack_aec[7] = 0xffffffff;
    aiStack_aec[8] = 0xffffffff;
    aiStack_aec[1] = 0xffffffff;
    aiStack_aec[2] = 0xffffffff;
    aiStack_aec[3] = 0xffffffff;
    aiStack_aec[4] = 0xffffffff;
    aiStack_aec[0x11] = 0xffffffff;
    uVar1 = local_b60 + 1;
    iVar12 = FWadCollection::GetLumpNamespace(&Wads,uVar21);
    skins[uVar1].namespc = iVar12;
    local_b78 = (ulong)uVar21;
    FScanner::FScanner(&local_a48,uVar21);
    local_b48 = uVar25 * 0x40;
    local_b40 = local_b48 + 0x53;
    local_ba0 = (PClassPlayerPawn *)0x0;
    local_b80 = (PClassPlayerPawn *)0x0;
    bVar5 = false;
    local_b88 = 0;
    iVar12 = 0;
LAB_00516ea1:
    bVar11 = FScanner::GetString(&local_a48);
    if (!bVar11) goto LAB_00517540;
    strncpy(local_a98,local_a48.String,0x40);
    bVar11 = FScanner::GetString(&local_a48);
    if ((!bVar11) || (*local_a48.String != '=')) {
      Printf(200,"Bad format for skin %d: %s\n",uVar1);
      goto LAB_00517540;
    }
    FScanner::GetString(&local_a48);
    iVar13 = strcasecmp(local_a98,"name");
    pFVar22 = skins;
    if (iVar13 == 0) {
      __dest = skins + uVar1;
      strncpy(__dest->name,local_a48.String,0x10);
      if (uVar1 != 0) {
        lVar20 = 0;
        uVar25 = uVar1;
        do {
          iVar13 = strcasecmp(__dest->name,pFVar22->name);
          if (iVar13 == 0) {
            mysnprintf(__dest->name,0x11,"skin%d",uVar1);
            Printf(200,"Skin %s duplicated as %s\n",(long)skins - lVar20);
            break;
          }
          lVar20 = lVar20 + -0x40;
          pFVar22 = pFVar22 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      goto LAB_00516ea1;
    }
    iVar13 = strcasecmp(local_a98,"sprite");
    if (iVar13 == 0) {
      lVar20 = 3;
      do {
        pcVar9 = local_a48.String;
        iVar12 = toupper((int)*(char *)((long)local_a48.String + lVar20));
        *(char *)((long)pcVar9 + lVar20) = (char)iVar12;
        bVar11 = lVar20 != 0;
        lVar20 = lVar20 + -1;
      } while (bVar11);
      iVar12 = *(int *)local_a48.String;
      goto LAB_00516ea1;
    }
    iVar13 = strcasecmp(local_a98,"crouchsprite");
    if (iVar13 == 0) {
      lVar20 = 3;
      do {
        pcVar9 = local_a48.String;
        iVar13 = toupper((int)*(char *)((long)local_a48.String + lVar20));
        *(char *)((long)pcVar9 + lVar20) = (char)iVar13;
        bVar11 = lVar20 != 0;
        lVar20 = lVar20 + -1;
      } while (bVar11);
      local_b88 = *(int *)local_a48.String;
      goto LAB_00516ea1;
    }
    iVar13 = strcasecmp(local_a98,"face");
    lVar20 = local_b40;
    if (iVar13 == 0) {
      lVar24 = 0;
      do {
        iVar13 = toupper((int)*(char *)((long)local_a48.String + lVar24 + 2));
        skins->name[lVar24 + lVar20] = (char)iVar13;
        lVar24 = lVar24 + -1;
      } while (lVar24 != -3);
      skins[uVar1].face[3] = '\0';
      goto LAB_00516ea1;
    }
    iVar13 = strcasecmp(local_a98,"gender");
    if (iVar13 == 0) {
      iVar13 = D_GenderToInt(local_a48.String);
      skins[uVar1].gender = (BYTE)iVar13;
      goto LAB_00516ea1;
    }
    iVar13 = strcasecmp(local_a98,"scale");
    if (iVar13 == 0) {
      dVar26 = atof(local_a48.String);
      pFVar22 = skins;
      dVar27 = 256.0;
      if (dVar26 <= 256.0) {
        dVar27 = dVar26;
      }
      dVar27 = (double)(~-(ulong)(1.52587890625e-05 < dVar26) & 0x3ef0000000000000 |
                       (ulong)dVar27 & -(ulong)(1.52587890625e-05 < dVar26));
      skins[uVar1].Scale.X = dVar27;
      pFVar22[uVar1].Scale.Y = dVar27;
      goto LAB_00516ea1;
    }
    iVar13 = strcasecmp(local_a98,"game");
    if (iVar13 != 0) {
      iVar13 = strcasecmp(local_a98,"class");
      if (iVar13 == 0) {
        uVar21 = D_PlayerClassToInt(local_a48.String);
        if ((int)uVar21 < 0) {
          bVar5 = true;
          goto LAB_00517540;
        }
        local_ba0 = PlayerClasses.Array[uVar21].Type;
        local_b80 = local_ba0;
      }
      else if (local_a98[0] == '*') {
        iVar13 = FWadCollection::CheckNumForName(&Wads,local_a48.String,skins[uVar1].namespc);
        if (iVar13 == -1) {
          iVar13 = FWadCollection::CheckNumForFullName(&Wads,local_a48.String,true,0xd);
        }
        if (iVar13 != -1) {
          iVar14 = strcasecmp(local_a98,"*pain");
          if (iVar14 == 0) {
            iVar13 = S_AddPlayerSound(skins[uVar1].name,(uint)skins[uVar1].gender,local_b38._0_4_,
                                      iVar13,true);
            uVar25 = 4;
            do {
              S_AddPlayerSoundExisting
                        (skins[uVar1].name,(uint)skins[uVar1].gender,
                         *(int *)(local_b38 + uVar25 * 4 + -4),iVar13,true);
              uVar25 = uVar25 - 1;
            } while (1 < uVar25);
          }
          else {
            iVar14 = S_FindSoundNoHash(local_a98);
            if (iVar14 != 0) {
              S_AddPlayerSound(skins[uVar1].name,(uint)skins[uVar1].gender,iVar14,iVar13,true);
            }
          }
        }
      }
      else {
        lVar20 = 0;
        piVar23 = aiStack_aec;
        do {
          piVar23 = piVar23 + 1;
          iVar13 = strcasecmp(local_a98,*(char **)((long)skinsoundnames[0] + lVar20));
          if (iVar13 == 0) {
            iVar13 = FWadCollection::CheckNumForName(&Wads,local_a48.String,skins[uVar1].namespc);
            *piVar23 = iVar13;
            if (iVar13 == -1) {
              iVar13 = FWadCollection::CheckNumForFullName(&Wads,local_a48.String,true,0xd);
              *piVar23 = iVar13;
            }
          }
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x110);
      }
      goto LAB_00516ea1;
    }
    if (gameinfo.gametype == GAME_Strife) {
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x50;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
    }
    else if (gameinfo.gametype == GAME_Heretic) {
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4f;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
    }
    else {
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
    }
    local_b80 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
    pcVar9 = local_a48.String;
    iVar13 = strcasecmp(local_a48.String,"heretic");
    if (iVar13 == 0) {
      if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        if (gameinfo.gametype != GAME_Heretic) {
          bVar5 = true;
        }
        local_ba0 = local_b80;
      }
      else {
        local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4f;
        pPVar16 = PClass::FindClass((FName *)local_948);
        pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
        local_ba0 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
LAB_00517436:
        skins[uVar1].othergame = true;
      }
    }
    else {
      iVar13 = strcasecmp(pcVar9,"strife");
      if (iVar13 == 0) {
        if (gameinfo.gametype != GAME_Strife) {
          bVar5 = true;
        }
      }
      else {
        if (gameinfo.gametype == GAME_Heretic) {
          local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
          pPVar16 = PClass::FindClass((FName *)local_948);
          pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
          local_ba0 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
          goto LAB_00517436;
        }
        if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
          bVar5 = true;
        }
      }
      local_ba0 = local_b80;
    }
    if (!bVar5) goto LAB_00516ea1;
LAB_00517540:
    pPVar18 = local_b80;
    if ((!bVar5) && (local_b80 == (PClassPlayerPawn *)0x0)) {
      if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        if (gameinfo.gametype == GAME_Heretic) {
          local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4f;
          pPVar16 = PClass::FindClass((FName *)local_948);
          pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
          pPVar18 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
          local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
          pPVar16 = PClass::FindClass((FName *)local_948);
          pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
          local_ba0 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
          skins[uVar1].othergame = true;
        }
        else {
          bVar5 = true;
          pPVar18 = (PClassPlayerPawn *)0x0;
        }
      }
      else {
        local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
        pPVar16 = PClass::FindClass((FName *)local_948);
        pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
        local_ba0 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
        pPVar18 = local_ba0;
      }
    }
    pFVar22 = skins;
    if (!bVar5) {
      skins[uVar1].range0start = local_ba0->ColorRangeStart;
      pFVar22[uVar1].range0end = local_ba0->ColorRangeEnd;
      if ((int)PlayerClasses.Count < 1) {
        bVar5 = true;
      }
      else {
        bVar5 = true;
        lVar20 = 0;
        do {
          pFVar7 = PlayerClasses.Array;
          pPVar3 = PlayerClasses.Array[lVar20].Type;
          pPVar19 = pPVar3;
          if (pPVar3 == pPVar18) {
LAB_00517698:
            if (((*(int *)(*(long *)((pPVar3->super_PClassActor).super_PClass.Defaults + 0x448) +
                          0x10) ==
                  *(int *)(*(long *)((pPVar18->super_PClassActor).super_PClass.Defaults + 0x448) +
                          0x10)) && (pPVar3->ColorRangeStart == pPVar18->ColorRangeStart)) &&
               (pPVar3->ColorRangeEnd == pPVar18->ColorRangeEnd)) {
              TArray<int,_int>::Grow(&PlayerClasses.Array[lVar20].Skins,1);
              pFVar7[lVar20].Skins.Array[pFVar7[lVar20].Skins.Count] = (int)uVar1;
              puVar2 = &pFVar7[lVar20].Skins.Count;
              *puVar2 = *puVar2 + 1;
              bVar5 = false;
            }
          }
          else {
            do {
              pPVar19 = (PClassPlayerPawn *)(pPVar19->super_PClassActor).super_PClass.ParentClass;
              if (pPVar19 == pPVar18) break;
            } while (pPVar19 != (PClassPlayerPawn *)0x0);
            if (pPVar19 != (PClassPlayerPawn *)0x0) goto LAB_00517698;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (int)PlayerClasses.Count);
      }
    }
    if (!bVar5) {
      if (skins[uVar1].name[0] == '\0') {
        mysnprintf(skins[uVar1].name,0x11,"skin%d");
      }
      if (iVar12 == 0) {
        FWadCollection::GetLumpName(&Wads,(char *)local_948,(int)local_b78 + 1);
        iVar12 = (int)local_948[0].super_spriteframe_t.Voxel;
      }
      iVar13 = (int)local_b78;
      iVar14 = FWadCollection::GetLumpNamespace(&Wads,iVar13);
      local_b78 = (ulong)(iVar13 + 1);
      iVar13 = 0;
      do {
        memset(local_948,0xff,0x910);
        lVar20 = 0;
        do {
          *(undefined2 *)((long)(local_948[0].super_spriteframe_t.Texture + 0x10) + lVar20) = 0;
          *(undefined8 *)
           ((long)&((spriteframe_t *)(local_948[0].super_spriteframe_t.Texture + -2))->Voxel +
           lVar20) = 0;
          lVar20 = lVar20 + 0x50;
        } while (lVar20 != 0x910);
        local_b8c = -1;
        iVar15 = iVar12;
        if ((iVar13 == 1) && ((local_b88 == 0 || (iVar15 = local_b88, local_b88 == iVar12)))) {
          skins[uVar1].crouchsprite = -1;
          bVar11 = false;
        }
        else {
          iVar12 = iVar15;
          uVar25 = local_b78 & 0xffffffff;
          while( true ) {
            lump_00 = (int)uVar25;
            iVar15 = FWadCollection::GetLumpNamespace(&Wads,lump_00);
            if (iVar15 != iVar14) break;
            FWadCollection::GetLumpName(&Wads,(char *)&local_b6c,lump_00);
            if (local_b6c == iVar12) {
              lump = FTextureManager::CreateTexture(&TexMan,lump_00,6);
              bVar11 = R_InstallSpriteLump(lump,(int)local_b68 - 0x41,local_b67,false,local_948,
                                           &local_b8c);
              if (bVar11 && local_b66 != '\0') {
                R_InstallSpriteLump(lump,(int)local_b66 - 0x41,local_b65,true,local_948,&local_b8c);
              }
            }
            uVar25 = (ulong)(lump_00 + 1);
          }
          if ((iVar13 == 0) && (local_b8c < 1)) {
            bVar5 = true;
            bVar11 = false;
            Printf(200,"Skin %s (#%d) has no frames. Removing.\n",skins + uVar1);
          }
          else {
            FWadCollection::GetLumpName(&Wads,(char *)&local_b54,(int)local_b78);
            uStack_b50 = uStack_b50 & 0xffffff00;
            TArray<spritedef_t,_spritedef_t>::Grow(&sprites,1);
            psVar8 = sprites.Array;
            uVar25 = (ulong)sprites.Count;
            psVar6 = sprites.Array + uVar25;
            psVar6->numframes = (undefined1)local_b4c;
            psVar6->field_0x9 = local_b4c._1_1_;
            psVar6->spriteframes = local_b4c._2_2_;
            aVar4._4_4_ = uStack_b50;
            aVar4.dwName = local_b54;
            psVar8[uVar25].field_0 = aVar4;
            uVar21 = sprites.Count;
            if (iVar13 == 0) {
              uVar10 = sprites.Count + 1;
              skins[uVar1].sprite = sprites.Count;
              sprites.Count = uVar10;
            }
            else {
              uVar10 = sprites.Count + 1;
              skins[uVar1].crouchsprite = sprites.Count;
              sprites.Count = uVar10;
            }
            bVar11 = true;
            R_InstallSprite(uVar21,local_948,&local_b8c);
          }
        }
      } while ((bVar11) && (bVar11 = iVar13 == 0, iVar13 = iVar13 + 1, bVar11));
    }
    uVar25 = local_b60;
    if (bVar5) {
      if (uVar1 < numskins - 1) {
        memmove(skins + uVar1,skins[2].name + local_b48,(numskins - local_b60) * 0x40 - 0x80);
      }
    }
    else {
      lVar20 = 0;
      iVar12 = 0;
      do {
        iVar13 = aiStack_aec[lVar20 + 1];
        if (iVar13 != -1) {
          if ((lVar20 == 0) || (iVar13 != aiStack_aec[lVar20])) {
            iVar12 = S_AddPlayerSound(skins[uVar1].name,(uint)skins[uVar1].gender,
                                      *(int *)(local_b38 + lVar20 * 4),iVar13,true);
          }
          else {
            S_AddPlayerSoundExisting
                      (skins[uVar1].name,(uint)skins[uVar1].gender,*(int *)(local_b38 + lVar20 * 4),
                       iVar12,true);
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x11);
      uVar25 = uVar1;
      if ((skins[uVar1].face[1] == '\0') || (skins[uVar1].face[2] == '\0')) {
        skins[uVar1].face[0] = '\0';
      }
    }
    FScanner::~FScanner(&local_a48);
    local_b60 = uVar25;
  } while( true );
}

Assistant:

void R_InitSkins (void)
{
	FSoundID playersoundrefs[NUMSKINSOUNDS];
	spritedef_t temp;
	int sndlumps[NUMSKINSOUNDS];
	char key[65];
	DWORD intname, crouchname;
	size_t i;
	int j, k, base;
	int lastlump;
	int aliasid;
	bool remove;
	PClassPlayerPawn *basetype, *transtype;

	key[sizeof(key)-1] = 0;
	i = PlayerClasses.Size () - 1;
	lastlump = 0;

	for (j = 0; j < NUMSKINSOUNDS; ++j)
	{
		playersoundrefs[j] = skinsoundnames[j][1];
	}

	while ((base = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		// The player sprite has 23 frames. This means that the S_SKIN
		// marker needs a minimum of 23 lumps after it.
		if (base >= Wads.GetNumLumps() - 23 || base == -1)
			continue;

		i++;
		for (j = 0; j < NUMSKINSOUNDS; j++)
			sndlumps[j] = -1;
		skins[i].namespc = Wads.GetLumpNamespace (base);

		FScanner sc(base);
		intname = 0;
		crouchname = 0;

		remove = false;
		basetype = NULL;
		transtype = NULL;

		// Data is stored as "key = data".
		while (sc.GetString ())
		{
			strncpy (key, sc.String, sizeof(key)-1);
			if (!sc.GetString() || sc.String[0] != '=')
			{
				Printf (PRINT_BOLD, "Bad format for skin %d: %s\n", (int)i, key);
				break;
			}
			sc.GetString ();
			if (0 == stricmp (key, "name"))
			{
				strncpy (skins[i].name, sc.String, 16);
				for (j = 0; (size_t)j < i; j++)
				{
					if (stricmp (skins[i].name, skins[j].name) == 0)
					{
						mysnprintf (skins[i].name, countof(skins[i].name), "skin%d", (int)i);
						Printf (PRINT_BOLD, "Skin %s duplicated as %s\n",
							skins[j].name, skins[i].name);
						break;
					}
				}
			}
			else if (0 == stricmp (key, "sprite"))
			{
				for (j = 3; j >= 0; j--)
					sc.String[j] = toupper (sc.String[j]);
				intname = *((DWORD *)sc.String);
			}
			else if (0 == stricmp (key, "crouchsprite"))
			{
				for (j = 3; j >= 0; j--)
					sc.String[j] = toupper (sc.String[j]);
				crouchname = *((DWORD *)sc.String);
			}
			else if (0 == stricmp (key, "face"))
			{
				for (j = 2; j >= 0; j--)
					skins[i].face[j] = toupper (sc.String[j]);
				skins[i].face[3] = '\0';
			}
			else if (0 == stricmp (key, "gender"))
			{
				skins[i].gender = D_GenderToInt (sc.String);
			}
			else if (0 == stricmp (key, "scale"))
			{
				skins[i].Scale.X = clamp(atof (sc.String), 1./65536, 256.);
				skins[i].Scale.Y = skins[i].Scale.X;
			}
			else if (0 == stricmp (key, "game"))
			{
				if (gameinfo.gametype == GAME_Heretic)
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
				else if (gameinfo.gametype == GAME_Strife)
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_StrifePlayer));
				else
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));

				transtype = basetype;

				if (stricmp (sc.String, "heretic") == 0)
				{
					if (gameinfo.gametype & GAME_DoomChex)
					{
						transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
						skins[i].othergame = true;
					}
					else if (gameinfo.gametype != GAME_Heretic)
					{
						remove = true;
					}
				}
				else if (stricmp (sc.String, "strife") == 0)
				{
					if (gameinfo.gametype != GAME_Strife)
					{
						remove = true;
					}
				}
				else
				{
					if (gameinfo.gametype == GAME_Heretic)
					{
						transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
						skins[i].othergame = true;
					}
					else if (!(gameinfo.gametype & GAME_DoomChex))
					{
						remove = true;
					}
				}

				if (remove)
					break;
			}
			else if (0 == stricmp (key, "class"))
			{ // [GRB] Define the skin for a specific player class
				int pclass = D_PlayerClassToInt (sc.String);

				if (pclass < 0)
				{
					remove = true;
					break;
				}

				basetype = transtype = PlayerClasses[pclass].Type;
			}
			else if (key[0] == '*')
			{ // Player sound replacment (ZDoom extension)
				int lump = Wads.CheckNumForName (sc.String, skins[i].namespc);
				if (lump == -1)
				{
					lump = Wads.CheckNumForFullName (sc.String, true, ns_sounds);
				}
				if (lump != -1)
				{
					if (stricmp (key, "*pain") == 0)
					{ // Replace all pain sounds in one go
						aliasid = S_AddPlayerSound (skins[i].name, skins[i].gender,
							playersoundrefs[0], lump, true);
						for (int l = 3; l > 0; --l)
						{
							S_AddPlayerSoundExisting (skins[i].name, skins[i].gender,
								playersoundrefs[l], aliasid, true);
						}
					}
					else
					{
						int sndref = S_FindSoundNoHash (key);
						if (sndref != 0)
						{
							S_AddPlayerSound (skins[i].name, skins[i].gender, sndref, lump, true);
						}
					}
				}
			}
			else
			{
				for (j = 0; j < NUMSKINSOUNDS; j++)
				{
					if (stricmp (key, skinsoundnames[j][0]) == 0)
					{
						sndlumps[j] = Wads.CheckNumForName (sc.String, skins[i].namespc);
						if (sndlumps[j] == -1)
						{ // Replacement not found, try finding it in the global namespace
							sndlumps[j] = Wads.CheckNumForFullName (sc.String, true, ns_sounds);
						}
					}
				}
				//if (j == 8)
				//	Printf ("Funny info for skin %i: %s = %s\n", i, key, sc.String);
			}
		}

		// [GRB] Assume Doom skin by default
		if (!remove && basetype == NULL)
		{
			if (gameinfo.gametype & GAME_DoomChex)
			{
				basetype = transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
			}
			else if (gameinfo.gametype == GAME_Heretic)
			{
				basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
				transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
				skins[i].othergame = true;
			}
			else
			{
				remove = true;
			}
		}

		if (!remove)
		{
			skins[i].range0start = transtype->ColorRangeStart;
			skins[i].range0end = transtype->ColorRangeEnd;

			remove = true;
			for (j = 0; j < (int)PlayerClasses.Size (); j++)
			{
				PClassPlayerPawn *type = PlayerClasses[j].Type;

				if (type->IsDescendantOf (basetype) &&
					GetDefaultByType(type)->SpawnState->sprite == GetDefaultByType(basetype)->SpawnState->sprite &&
					type->ColorRangeStart == basetype->ColorRangeStart &&
					type->ColorRangeEnd == basetype->ColorRangeEnd)
				{
					PlayerClasses[j].Skins.Push ((int)i);
					remove = false;
				}
			}
		}

		if (!remove)
		{
			if (skins[i].name[0] == 0)
				mysnprintf (skins[i].name, countof(skins[i].name), "skin%d", (int)i);

			// Now collect the sprite frames for this skin. If the sprite name was not
			// specified, use whatever immediately follows the specifier lump.
			if (intname == 0)
			{
				char name[9];
				Wads.GetLumpName (name, base+1);
				memcpy(&intname, name, 4);
			}

			int basens = Wads.GetLumpNamespace(base);

			for(int spr = 0; spr<2; spr++)
			{
				spriteframewithrotate sprtemp[MAX_SPRITE_FRAMES];
				memset (sprtemp, 0xFFFF, sizeof(sprtemp));
				for (k = 0; k < MAX_SPRITE_FRAMES; ++k)
				{
					sprtemp[k].Flip = 0;
					sprtemp[k].Voxel = NULL;
				}
				int maxframe = -1;

				if (spr == 1)
				{
					if (crouchname !=0 && crouchname != intname)
					{
						intname = crouchname;
					}
					else
					{
						skins[i].crouchsprite = -1;
						break;
					}
				}

				for (k = base + 1; Wads.GetLumpNamespace(k) == basens; k++)
				{
					char lname[9];
					DWORD lnameint;
					Wads.GetLumpName (lname, k);
					memcpy(&lnameint, lname, 4);
					if (lnameint == intname)
					{
						FTextureID picnum = TexMan.CreateTexture(k, FTexture::TEX_SkinSprite);
						bool res = R_InstallSpriteLump (picnum, lname[4] - 'A', lname[5], false, sprtemp, maxframe);

						if (lname[6] && res)
							R_InstallSpriteLump (picnum, lname[6] - 'A', lname[7], true, sprtemp, maxframe);
					}
				}

				if (spr == 0 && maxframe <= 0)
				{
					Printf (PRINT_BOLD, "Skin %s (#%d) has no frames. Removing.\n", skins[i].name, (int)i);
					remove = true;
					break;
				}

				Wads.GetLumpName (temp.name, base+1);
				temp.name[4] = 0;
				int sprno = (int)sprites.Push (temp);
				if (spr==0)	skins[i].sprite = sprno;
				else skins[i].crouchsprite = sprno;
				R_InstallSprite (sprno, sprtemp, maxframe);
			}
		}

		if (remove)
		{
			if (i < numskins-1)
				memmove (&skins[i], &skins[i+1], sizeof(skins[0])*(numskins-i-1));
			i--;
			continue;
		}

		// Register any sounds this skin provides
		aliasid = 0;
		for (j = 0; j < NUMSKINSOUNDS; j++)
		{
			if (sndlumps[j] != -1)
			{
				if (j == 0 || sndlumps[j] != sndlumps[j-1])
				{
					aliasid = S_AddPlayerSound (skins[i].name, skins[i].gender,
						playersoundrefs[j], sndlumps[j], true);
				}
				else
				{
					S_AddPlayerSoundExisting (skins[i].name, skins[i].gender,
						playersoundrefs[j], aliasid, true);
				}
			}
		}

		// Make sure face prefix is a full 3 chars
		if (skins[i].face[1] == 0 || skins[i].face[2] == 0)
		{
			skins[i].face[0] = 0;
		}
	}

	if (numskins > PlayerClasses.Size ())
	{ // The sound table may have changed, so rehash it.
		S_HashSounds ();
		S_ShrinkPlayerSoundLists ();
	}
}